

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinFT98_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  ulong uVar2;
  double vt;
  double vl;
  double vs;
  double vr;
  double e;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)N;
  if (N < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_unpolar
              (rho[uVar2],sigma[uVar2],lapl[uVar2],tau[uVar2],&local_38,&local_40,&local_48,
               &local_50,&local_58);
    eps[uVar2] = local_38 * scal_fact + eps[uVar2];
    vrho[uVar2] = local_40 * scal_fact + vrho[uVar2];
    vsigma[uVar2] = local_48 * scal_fact + vsigma[uVar2];
    vtau[uVar2] = local_58 * scal_fact + vtau[uVar2];
    vlapl[uVar2] = local_50 * scal_fact + vlapl[uVar2];
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}